

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O2

void __thiscall Liby::http::ReplyParser::parse(ReplyParser *this,char *begin,char *end)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  mapped_type *__str;
  char *end_00;
  allocator local_51;
  key_type local_50;
  
  pcVar4 = begin;
  pcVar3 = begin;
  switch(this->progress_) {
  case 0:
    this->progress_ = 1;
  case 1:
    local_50._M_dataplus._M_p._0_1_ = 0x20;
    pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(begin,end);
    if ((pcVar3 != (char *)0x0) && (bVar1 = ParseHttpVersion(this,begin,pcVar3), bVar1)) {
      pcVar3 = pcVar3 + 1;
      this->bytes_ = this->bytes_ + ((int)pcVar3 - (int)begin);
switchD_00118eea_caseD_2:
      local_50._M_dataplus._M_p._0_1_ = 0x20;
      pcVar4 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         (pcVar3,end);
      if ((pcVar4 != (char *)0x0) && (bVar1 = ParseStatus(this,pcVar3,pcVar4), bVar1)) {
        pcVar4 = pcVar4 + 1;
        this->bytes_ = this->bytes_ + ((int)pcVar4 - (int)pcVar3);
switchD_00118eea_caseD_3:
        local_50._M_dataplus._M_p._0_1_ = 10;
        pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar4,end);
        if (pcVar3 != (char *)0x0) {
          end_00 = pcVar3 + -1;
          if (pcVar3[-1] != '\r') {
            end_00 = pcVar3;
          }
          ParseStatusString(this,pcVar4,end_00);
          begin = pcVar3 + 1;
          this->bytes_ = this->bytes_ + ((int)begin - (int)pcVar4);
switchD_00118eea_caseD_4:
          while (begin != end) {
            local_50._M_dataplus._M_p._0_1_ = 10;
            pcVar4 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                               (begin,end,&local_50);
            if (pcVar4 == (char *)0x0) {
              return;
            }
            iVar2 = (int)begin;
            if ((begin == pcVar4) || (begin + 1 == pcVar4)) {
              this->progress_ = 5;
              begin = pcVar4 + 1;
              this->bytes_ = this->bytes_ + ((int)begin - iVar2);
              break;
            }
            pcVar3 = pcVar4;
            if (pcVar4[-1] == '\r') {
              pcVar3 = pcVar4 + -1;
            }
            bVar1 = ParseHeader(this,begin,pcVar3);
            if (!bVar1) {
              return;
            }
            begin = pcVar4 + 1;
            this->bytes_ = this->bytes_ + ((int)begin - iVar2);
          }
          goto switchD_00118eea_caseD_5;
        }
      }
    }
    break;
  case 2:
    goto switchD_00118eea_caseD_2;
  case 3:
    goto switchD_00118eea_caseD_3;
  case 4:
    goto switchD_00118eea_caseD_4;
  case 5:
switchD_00118eea_caseD_5:
    std::__cxx11::string::string((string *)&local_50,"Content-Length",&local_51);
    __str = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&(this->super_Reply).headers_,&local_50);
    iVar2 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_50);
    if (iVar2 == 0) {
      this->progress_ = 6;
    }
    else if ((long)iVar2 <= (long)end - (long)begin) {
      this->progress_ = 6;
      this->bytes_ = this->bytes_ + iVar2;
      Buffer::append(&(this->super_Reply).content_,begin,(long)iVar2);
    }
    break;
  default:
    break;
  }
  return;
}

Assistant:

void ReplyParser::parse(const char *begin, const char *end) {
    bool flag;
    const char *finish = nullptr;
    switch (progress_) {
    default:
        break;
    case Good:
        break;
    case ParseStarting:
        progress_ = ParsingVersion;
    case ParsingVersion:
        finish = std::find(begin, end, ' ');
        if (finish == nullptr)
            return;
        flag = ParseHttpVersion(begin, finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingStatus:
        finish = std::find(begin, end, ' ');
        if (finish == nullptr)
            return;
        flag = ParseStatus(begin, finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingStatusString:
        finish = std::find(begin, end, '\n');
        if (finish == nullptr)
            return;
        flag = ParseStatusString(begin,
                                 *(finish - 1) == '\r' ? finish - 1 : finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingHeaders: {
        while (begin != end) {
            finish = std::find(begin, end, '\n');
            if (finish == nullptr)
                return;
            if (begin == finish || begin + 1 == finish) {
                progress_ = ParsingBody;
                bytes_ += ++finish - begin;
                begin = finish;
                break;
            }
            flag =
                ParseHeader(begin, *(finish - 1) == '\r' ? finish - 1 : finish);
            if (flag == false)
                return;
            bytes_ += ++finish - begin;
            begin = finish;
        }
    }
    case ParsingBody: {
        int len = std::stoi(headers_["Content-Length"]);
        if (len == 0) {
            progress_ = Good;
            return;
        } else if (end - begin < len) {
            return;
        } else if (end - begin >= len) {
            progress_ = Good;
            bytes_ += len;
            content_.append(begin, len);
            return;
        }
    }
    }
}